

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O2

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::UnChain
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *pBuf,charcount_t bufLen)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Data **ppDVar5;
  charcount_t *src;
  charcount_t *pcVar6;
  uint uVar7;
  charcount_t *pcVar8;
  
  uVar7 = this->count;
  uVar3 = uVar7;
  if (this->secondChunk == (Data *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe0,"(this->IsChained())","this->IsChained()");
    if (!bVar2) goto LAB_006c4789;
    *puVar4 = 0;
    uVar3 = this->count;
  }
  if (bufLen < uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe2,"(bufLen >= this->count)","bufLen >= this->count");
    if (!bVar2) {
LAB_006c4789:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ppDVar5 = &this->secondChunk;
  src = (charcount_t *)this->firstChunk;
  pcVar6 = src;
  pcVar8 = &this->firstChunkLength;
  while( true ) {
    if ((Data *)pcVar6 == this->lastChunk) break;
    uVar3 = *pcVar8;
    if (bufLen < uVar3) goto LAB_006c477f;
    pcVar6 = (charcount_t *)*ppDVar5;
    js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)src,(ulong)uVar3);
    bufLen = bufLen - uVar3;
    pBuf = pBuf + uVar3;
    uVar7 = uVar7 - uVar3;
    src = pcVar6 + 4;
    ppDVar5 = (Data **)(pcVar6 + 2);
    pcVar8 = pcVar6;
  }
  if (uVar7 <= bufLen) {
    js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)(this->lastChunk + 1),(ulong)uVar7);
    return;
  }
LAB_006c477f:
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void UnChain(__out __ecount(bufLen) char16 *pBuf, charcount_t bufLen)
        {
            charcount_t lastChunkCount = this->count;

            Assert(this->IsChained());

            Assert(bufLen >= this->count);
            char16 *pSrcBuf = this->firstChunk->u.single.buffer;
            Data *next = this->secondChunk;
            charcount_t srcLength = this->firstChunkLength;

            for (Data *chunk = this->firstChunk; chunk != this->lastChunk; next = chunk->u.chained.next)
            {
                if (bufLen < srcLength)
                {
                    Throw::FatalInternalError();
                }
                js_wmemcpy_s(pBuf, bufLen, pSrcBuf, srcLength);
                bufLen -= srcLength;
                pBuf += srcLength;
                lastChunkCount -= srcLength;

                chunk = next;
                pSrcBuf = chunk->u.chained.buffer;
                srcLength = chunk->u.chained.length;
            }

            if (bufLen < lastChunkCount)
            {
                Throw::FatalInternalError();
            }
            js_wmemcpy_s(pBuf, bufLen, this->lastChunk->u.chained.buffer, lastChunkCount);
        }